

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O1

size_t pack_duration(char **buf,DurationMsg *cmsg)

{
  uint uVar1;
  uchar *ubuf;
  char *pcVar2;
  
  pcVar2 = (char *)emalloc(8);
  *buf = pcVar2;
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\x03';
  uVar1 = cmsg->duration;
  if (-1 < (int)uVar1) {
    *(uint *)(pcVar2 + 4) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    return 8;
  }
  eprintf("Value of cmsg->duration (%d) too big to pack, max allowed %u\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
          ,0x11a,(ulong)uVar1,0xffffffff);
}

Assistant:

static size_t pack_duration(char **buf, DurationMsg * cmsg)
{
    char *ptr;
    size_t len;

    len = 4 + 4;
    *buf = ptr = (char *)emalloc(len);

    pack_type(&ptr, CK_MSG_DURATION);
    if((size_t) cmsg->duration > (size_t) CK_UINT32_MAX)
        eprintf("Value of cmsg->duration (%d) too big to pack, max allowed %u\n",
                __FILE__, __LINE__, cmsg->duration, CK_UINT32_MAX);
    pack_int(&ptr, (ck_uint32) cmsg->duration);

    return len;
}